

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct::create_pipeline(InnerProduct *this,Option *opt)

{
  Mat *pMVar1;
  float fVar2;
  int *piVar3;
  void *pvVar4;
  long *plVar5;
  size_t sVar6;
  Allocator *pAVar7;
  InnerProduct *pIVar8;
  Option *pOVar9;
  int iVar10;
  Layer *pLVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  Mat int8_weight_data;
  Mat weight_data_n;
  Mat int8_weight_data_n;
  Option opt_q;
  ParamDict pd;
  Mat local_a58;
  InnerProduct *local_a10;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_a08;
  Option *local_a00;
  ModelBinFromMatArray local_9f8;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  int iStack_9e0;
  Allocator *local_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  long local_9c0;
  void *local_9b8;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  int iStack_9a0;
  Allocator *local_998;
  undefined8 local_990;
  undefined8 uStack_988;
  long local_980;
  size_t local_970;
  undefined1 local_968 [16];
  undefined4 local_958;
  int iStack_954;
  Allocator *pAStack_950;
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined8 local_938;
  ParamDict local_930;
  
  local_970 = (this->weight_data).elemsize;
  if ((local_970 == 1) && (opt->use_int8_inference == false)) {
    create_pipeline();
    return -1;
  }
  if (opt->use_int8_inference == true && local_970 == 4) {
    bVar16 = this->int8_scale_term != 0;
  }
  else {
    bVar16 = (bool)(local_970 == 1 & opt->use_int8_inference);
  }
  this->use_int8_inference = bVar16;
  local_a10 = this;
  local_a00 = opt;
  if (bVar16 != false) {
    pLVar11 = create_layer(0x39);
    this->quantize = pLVar11;
    ParamDict::ParamDict(&local_930);
    ParamDict::set(&local_930,0,this->bottom_blob_int8_scale);
    pOVar9 = local_a00;
    (*this->quantize->_vptr_Layer[2])(this->quantize,&local_930);
    (*this->quantize->_vptr_Layer[4])(this->quantize,pOVar9);
    lVar14 = 0x8c0;
    do {
      piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar14);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = *(void **)((long)&local_930.params[0].type + lVar14);
          plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar14);
          if (plVar5 == (long *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar14 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar14 + 4) = 0;
      *(undefined8 *)((long)&local_930.params[0].type + lVar14) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.data + lVar14) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar14) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.dims + lVar14) = 0;
      *(undefined8 *)((long)&local_930.params[0].v.h + lVar14) = 0;
      lVar14 = lVar14 + -0x48;
    } while (lVar14 != -0x40);
    local_a08 = &this->dequantize_ops;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (local_a08,(long)this->num_output);
    if (0 < this->num_output) {
      lVar14 = 0;
      do {
        pLVar11 = create_layer(0x3a);
        (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar14] = pLVar11;
        fVar2 = *(float *)((long)(this->weight_data_int8_scales).data + lVar14 * 4);
        local_968 = ZEXT416(~-(uint)(fVar2 == 0.0) &
                            (uint)(1.0 / (this->bottom_blob_int8_scale * fVar2)));
        ParamDict::ParamDict(&local_930);
        ParamDict::set(&local_930,0,(float)local_968._0_4_);
        ParamDict::set(&local_930,1,this->bias_term);
        ParamDict::set(&local_930,2,1);
        pLVar11 = (local_a08->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar14];
        (*pLVar11->_vptr_Layer[2])(pLVar11,&local_930);
        sVar6 = (this->bias_data).elemsize;
        local_a58.data = (void *)(sVar6 * lVar14 + (long)(this->bias_data).data);
        local_a58.elempack = (this->bias_data).elempack;
        local_a58.allocator = (this->bias_data).allocator;
        uStack_9e8 = (undefined4)sVar6;
        uStack_9e4 = (undefined4)(sVar6 >> 0x20);
        local_a58.cstep = 1;
        local_a58.h = 1;
        local_a58.c = 1;
        local_a58.dims = 1;
        local_a58.w = 1;
        local_a58.elemsize._4_4_ = uStack_9e4;
        local_a58.elemsize._0_4_ = uStack_9e8;
        local_a58.refcount._4_4_ = 0;
        local_a58.refcount._0_4_ = 0;
        uStack_9e8 = 0;
        uStack_9e4 = 0;
        iStack_9e0 = 0;
        local_9f8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
        local_9f8.weights._0_4_ = 0;
        local_9f8.weights._4_4_ = 0;
        local_9d0 = 0;
        uStack_9c8 = 0;
        local_9c0 = 0;
        pLVar11 = (local_a08->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar14];
        local_9d8 = local_a58.allocator;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_9f8,&local_a58);
        (*pLVar11->_vptr_Layer[3])(pLVar11,&local_9f8);
        ModelBin::~ModelBin(&local_9f8.super_ModelBin);
        (*(local_a08->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar14]->_vptr_Layer[4])();
        piVar3 = (int *)CONCAT44(local_a58.refcount._4_4_,local_a58.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_a58.allocator == (Allocator *)0x0) {
              if (local_a58.data != (void *)0x0) {
                free(local_a58.data);
              }
            }
            else {
              (**(code **)(*(long *)local_a58.allocator + 0x18))();
            }
          }
        }
        local_a58.elemsize._0_4_ = 0;
        local_a58.elemsize._4_4_ = 0;
        local_a58.elempack = 0;
        local_a58.data = (void *)0x0;
        local_a58.refcount._0_4_ = 0;
        local_a58.refcount._4_4_ = 0;
        local_a58.dims = 0;
        local_a58.w = 0;
        local_a58.h = 0;
        local_a58.c = 0;
        local_a58.cstep = 0;
        lVar12 = 0x8c0;
        do {
          piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar12);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_930.params[0].type + lVar12);
              plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar12);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar12 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar12 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].type + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.dims + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.h + lVar12) = 0;
          lVar12 = lVar12 + -0x48;
        } while (lVar12 != -0x40);
        lVar14 = lVar14 + 1;
        this = local_a10;
      } while (lVar14 < local_a10->num_output);
    }
  }
  if ((local_970 == 4) && (this->use_int8_inference == true)) {
    local_a58.w = this->weight_data_size;
    local_a58.cstep = (size_t)local_a58.w;
    local_a58.data = (void *)0x0;
    local_a58.refcount._0_4_ = 0;
    local_a58.refcount._4_4_ = 0;
    local_a58.refcount = (int *)0x0;
    local_a58.elemsize._0_4_ = 1;
    local_a58.elemsize._4_4_ = 0;
    local_a58.elempack = 1;
    local_a58.allocator = (Allocator *)0x0;
    local_a58.dims = 1;
    local_a58.h = 1;
    local_a58.c = 1;
    if (local_a58.w != 0) {
      uVar15 = local_a58.cstep + 3 & 0xfffffffffffffffc;
      local_930.params[0]._0_8_ = (void *)0x0;
      iVar10 = posix_memalign((void **)&local_930,0x10,uVar15 + 4);
      if (iVar10 != 0) {
        local_930.params[0]._0_8_ = (void *)0x0;
      }
      local_a58.data = (void *)local_930.params[0]._0_8_;
      local_a58.refcount = (int *)(local_930.params[0]._0_8_ + uVar15);
      *(undefined4 *)(local_930.params[0]._0_8_ + uVar15) = 1;
    }
    if (local_a58.data == (void *)0x0) {
      bVar16 = true;
    }
    else {
      bVar16 = (long)local_a58.c * local_a58.cstep == 0;
    }
    if (bVar16) {
      if (local_a58.refcount != (int *)0x0) {
        LOCK();
        *local_a58.refcount = *local_a58.refcount + -1;
        UNLOCK();
        if (*local_a58.refcount == 0) {
          if (local_a58.allocator == (Allocator *)0x0) {
            if (local_a58.data != (void *)0x0) {
              free(local_a58.data);
            }
          }
          else {
            (**(code **)(*(long *)local_a58.allocator + 0x18))();
          }
        }
      }
      return -100;
    }
    local_a08 = (vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                ((ulong)local_a08 & 0xffffffffffffff00);
    iVar10 = this->weight_data_size / this->num_output;
    if (0 < this->num_output) {
      lVar14 = (long)iVar10;
      lVar12 = 0;
      do {
        pLVar11 = create_layer(0x39);
        ParamDict::ParamDict(&local_930);
        ParamDict::set(&local_930,0,
                       *(float *)((long)(local_a10->weight_data_int8_scales).data + lVar12 * 4));
        (*pLVar11->_vptr_Layer[2])(pLVar11,&local_930);
        (*pLVar11->_vptr_Layer[4])(pLVar11,local_a00);
        local_958 = *(undefined4 *)local_a00;
        iStack_954 = local_a00->num_threads;
        local_948 = *(undefined4 *)&local_a00->workspace_allocator;
        uStack_944 = *(undefined4 *)((long)&local_a00->workspace_allocator + 4);
        uStack_940._0_1_ = local_a00->use_winograd_convolution;
        uStack_940._1_1_ = local_a00->use_sgemm_convolution;
        uStack_940._2_1_ = local_a00->use_int8_inference;
        uStack_940._3_1_ = local_a00->use_vulkan_compute;
        uStack_93c._0_1_ = local_a00->use_fp16_packed;
        uStack_93c._1_1_ = local_a00->use_fp16_storage;
        uStack_93c._2_1_ = local_a00->use_fp16_arithmetic;
        uStack_93c._3_1_ = local_a00->use_int8_storage;
        local_938._0_1_ = local_a00->use_int8_arithmetic;
        local_938._1_1_ = local_a00->use_packing_layout;
        local_938._2_6_ = *(undefined6 *)&local_a00->field_0x22;
        pAStack_950 = local_a58.allocator;
        sVar6 = (local_a10->weight_data).elemsize;
        local_9f8.super_ModelBin._vptr_ModelBin =
             (_func_int **)(sVar6 * lVar12 * lVar14 + (long)(local_a10->weight_data).data);
        iStack_9e0 = (local_a10->weight_data).elempack;
        local_9d8 = (local_a10->weight_data).allocator;
        local_9f8.weights._0_4_ = 0;
        local_9f8.weights._4_4_ = 0;
        uStack_9e8 = (undefined4)sVar6;
        uStack_9e4 = (undefined4)(sVar6 >> 0x20);
        local_9d0 = CONCAT44(iVar10,1);
        uStack_9c8 = 0x100000001;
        local_9b8 = (void *)(lVar12 * lVar14 *
                             CONCAT44(local_a58.elemsize._4_4_,(undefined4)local_a58.elemsize) +
                            (long)local_a58.data);
        uStack_9b0 = 0;
        uStack_9ac = 0;
        uStack_9a8 = (undefined4)local_a58.elemsize;
        uStack_9a4 = local_a58.elemsize._4_4_;
        iStack_9a0 = local_a58.elempack;
        local_998 = local_a58.allocator;
        local_990 = CONCAT44(iVar10,1);
        uStack_988 = 0x100000001;
        local_9c0 = lVar14;
        local_980 = lVar14;
        (*pLVar11->_vptr_Layer[7])(pLVar11,&local_9f8,&local_9b8,&local_958);
        (*pLVar11->_vptr_Layer[1])(pLVar11);
        piVar3 = (int *)CONCAT44(uStack_9ac,uStack_9b0);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_998 == (Allocator *)0x0) {
              if (local_9b8 != (void *)0x0) {
                free(local_9b8);
              }
            }
            else {
              (**(code **)(*(long *)local_998 + 0x18))();
            }
          }
        }
        uStack_9a8 = 0;
        uStack_9a4 = 0;
        iStack_9a0 = 0;
        local_9b8 = (void *)0x0;
        uStack_9b0 = 0;
        uStack_9ac = 0;
        local_990 = 0;
        uStack_988 = 0;
        local_980 = 0;
        piVar3 = (int *)CONCAT44(local_9f8.weights._4_4_,local_9f8.weights._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_9d8 == (Allocator *)0x0) {
              if (local_9f8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                free(local_9f8.super_ModelBin._vptr_ModelBin);
              }
            }
            else {
              (**(code **)(*(long *)local_9d8 + 0x18))();
            }
          }
        }
        uStack_9e8 = 0;
        uStack_9e4 = 0;
        iStack_9e0 = 0;
        local_9f8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
        local_9f8.weights._0_4_ = 0;
        local_9f8.weights._4_4_ = 0;
        local_9d0 = 0;
        uStack_9c8 = 0;
        local_9c0 = 0;
        lVar13 = 0x8c0;
        do {
          piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar13);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_930.params[0].type + lVar13);
              plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar13);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].type + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.dims + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.h + lVar13) = 0;
          lVar13 = lVar13 + -0x48;
        } while (lVar13 != -0x40);
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_a10->num_output);
    }
    pIVar8 = local_a10;
    pMVar1 = &local_a10->weight_data;
    if (pMVar1 != &local_a58) {
      if (local_a58.refcount != (int *)0x0) {
        LOCK();
        *local_a58.refcount = *local_a58.refcount + 1;
        UNLOCK();
      }
      piVar3 = (local_a10->weight_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (local_a10->weight_data).data;
          pAVar7 = (local_a10->weight_data).allocator;
          if (pAVar7 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar7 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(pIVar8->weight_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(pIVar8->weight_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (pIVar8->weight_data).refcount = (int *)0x0;
      (pIVar8->weight_data).dims = 0;
      (pIVar8->weight_data).w = 0;
      (pIVar8->weight_data).h = 0;
      (pIVar8->weight_data).c = 0;
      (pIVar8->weight_data).cstep = 0;
      (pIVar8->weight_data).data = local_a58.data;
      (pIVar8->weight_data).refcount = local_a58.refcount;
      (pIVar8->weight_data).elemsize =
           CONCAT44(local_a58.elemsize._4_4_,(undefined4)local_a58.elemsize);
      (pIVar8->weight_data).elempack = local_a58.elempack;
      (pIVar8->weight_data).allocator = local_a58.allocator;
      (pIVar8->weight_data).dims = local_a58.dims;
      (pIVar8->weight_data).w = local_a58.w;
      (pIVar8->weight_data).h = local_a58.h;
      (pIVar8->weight_data).c = local_a58.c;
      (pIVar8->weight_data).cstep = local_a58.cstep;
    }
    if (local_a58.refcount != (int *)0x0) {
      LOCK();
      *local_a58.refcount = *local_a58.refcount + -1;
      UNLOCK();
      if (*local_a58.refcount == 0) {
        if (local_a58.allocator == (Allocator *)0x0) {
          if (local_a58.data != (void *)0x0) {
            free(local_a58.data);
          }
        }
        else {
          (**(code **)(*(long *)local_a58.allocator + 0x18))();
        }
      }
    }
    if ((char)local_a08 != '\0') {
      return -100;
    }
  }
  return 0;
}

Assistant:

int InnerProduct::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    // initial the quantize,dequantize op layer
    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->create_pipeline(opt);
        }

        dequantize_ops.resize(num_output);
        for (int n=0; n<num_output; n++)
        {
            dequantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;

            if (weight_data_int8_scales[n] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);  // bias_term
            pd.set(2, 1);          // bias_data_size

            dequantize_ops[n]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(n, 1);

            dequantize_ops[n]->load_model(ModelBinFromMatArray(weights));

            dequantize_ops[n]->create_pipeline(opt);
        }
    }

    // runtime quantize the weight data
    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int n=0; n<num_output; n++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[n]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * n, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * n, weight_data_size_output);
            op->forward(weight_data_n, int8_weight_data_n, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    return 0;
}